

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorHandling.cpp
# Opt level: O3

void llvm::llvm_unreachable_internal(char *msg,char *file,uint line)

{
  raw_ostream *prVar1;
  size_t sVar2;
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  StringRef Str_02;
  StringRef Str_03;
  StringRef Str_04;
  
  if (msg != (char *)0x0) {
    prVar1 = dbgs();
    sVar2 = strlen(msg);
    Str.Length = sVar2;
    Str.Data = msg;
    prVar1 = raw_ostream::operator<<(prVar1,Str);
    Str_00.Length = 1;
    Str_00.Data = "\n";
    raw_ostream::operator<<(prVar1,Str_00);
  }
  prVar1 = dbgs();
  Str_01.Length = 0x14;
  Str_01.Data = "UNREACHABLE executed";
  raw_ostream::operator<<(prVar1,Str_01);
  if (file != (char *)0x0) {
    prVar1 = dbgs();
    Str_02.Length = 4;
    Str_02.Data = " at ";
    prVar1 = raw_ostream::operator<<(prVar1,Str_02);
    sVar2 = strlen(file);
    Str_03.Length = sVar2;
    Str_03.Data = file;
    prVar1 = raw_ostream::operator<<(prVar1,Str_03);
    Str_04.Length = 1;
    Str_04.Data = ":";
    prVar1 = raw_ostream::operator<<(prVar1,Str_04);
    raw_ostream::operator<<(prVar1,(ulong)line);
  }
  prVar1 = dbgs();
  raw_ostream::operator<<(prVar1,"!\n");
  abort();
}

Assistant:

void llvm::llvm_unreachable_internal(const char *msg, const char *file,
                                     unsigned line) {
  // This code intentionally doesn't call the ErrorHandler callback, because
  // llvm_unreachable is intended to be used to indicate "impossible"
  // situations, and not legitimate runtime errors.
  if (msg)
    dbgs() << msg << "\n";
  dbgs() << "UNREACHABLE executed";
  if (file)
    dbgs() << " at " << file << ":" << line;
  dbgs() << "!\n";
  abort();
#ifdef LLVM_BUILTIN_UNREACHABLE
  // Windows systems and possibly others don't declare abort() to be noreturn,
  // so use the unreachable builtin to avoid a Clang self-host warning.
  LLVM_BUILTIN_UNREACHABLE;
#endif
}